

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtsc.c
# Opt level: O2

int busy_loop_delay(int milliseconds)

{
  int iVar1;
  int iVar2;
  uint64_t c;
  uint64_t a;
  uint64_t local_38;
  uint64_t local_30;
  
  sys_precise_clock(&local_30);
  iVar2 = 0;
  while( true ) {
    sys_precise_clock(&local_38);
    if ((ulong)(long)milliseconds < (local_38 - local_30) / 1000) break;
    iVar1 = busy_loop(0);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int busy_loop_delay(int milliseconds)
{
	int cycles = 0, r = 0, first = 1;
	uint64_t a, b, c;
	sys_precise_clock(&a);
	while (1) {
		sys_precise_clock(&c);
		if ((c - a) / 1000 > milliseconds) return r;
		r += busy_loop(cycles);
		if (first) {
			first = 0;
		} else {
			if (c - b < 1000) cycles *= 2;
			if (c - b > 10000) cycles /= 2;
		}
		b = c;
	}
}